

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarExecFuse.cpp
# Opt level: O1

void anon_unknown.dwarf_5af7::check_file_sanity(string *path,Expectation expected,mode_t perms)

{
  bool bVar1;
  int iVar2;
  __uid_t _Var3;
  __gid_t _Var4;
  int *piVar5;
  char *pcVar6;
  ostream *poVar7;
  stat st;
  undefined1 auStack_238 [392];
  stat local_b0;
  
  iVar2 = stat((path->_M_dataplus)._M_p,&local_b0);
  if (iVar2 == 0) {
    _Var3 = geteuid();
    if (local_b0.st_uid == _Var3) {
      _Var4 = getegid();
      if ((local_b0.st_gid == _Var4) ||
         (bVar1 = tools::xar::is_user_in_group(local_b0.st_gid), bVar1)) {
        if (expected == File) {
          if ((local_b0.st_mode & 0xf000) != 0x8000) {
            memset(auStack_238,0,0x188);
            std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
            poVar7 = (ostream *)(auStack_238 + 0x10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"FATAL ",6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                       ,0x5d);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x65);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"Should be a normal file: ",0x19);
            std::operator<<(poVar7,(string *)path);
            goto LAB_00106eb6;
          }
        }
        else if ((expected == Directory) && ((local_b0.st_mode & 0xf000) != 0x4000)) {
          memset(auStack_238,0,0x188);
          std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
          poVar7 = (ostream *)(auStack_238 + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"FATAL ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                     ,0x5d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x62);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Should be a directory: ",0x17);
          std::operator<<(poVar7,(string *)path);
          goto LAB_00106eb6;
        }
        if ((local_b0.st_mode & 0xfff) == perms) {
          return;
        }
        memset(auStack_238,0,0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
        poVar7 = (ostream *)(auStack_238 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"FATAL ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                   ,0x5d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Invalid permissions on ",0x17);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(path->_M_dataplus)._M_p,path->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", expected ",0xb);
        *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) =
             *(uint *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ",6);
        std::ostream::operator<<(poVar7,local_b0.st_mode & 0xfff);
      }
      else {
        memset(auStack_238,0,0x188);
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
        poVar7 = (ostream *)(auStack_238 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"FATAL ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                   ,0x5d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x5e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Invalid group of ",0x11);
        std::operator<<(poVar7,(string *)path);
      }
    }
    else {
      memset(auStack_238,0,0x188);
      std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
      poVar7 = (ostream *)(auStack_238 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"FATAL ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x59);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Invalid owner of ",0x11);
      std::operator<<(poVar7,(string *)path);
    }
  }
  else {
    memset(auStack_238,0,0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)auStack_238);
    poVar7 = (ostream *)(auStack_238 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"FATAL ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/facebookincubator[P]xar/xar/XarExecFuse.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"stat(path.c_str(), &st) == 0",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar7,pcVar6);
  }
LAB_00106eb6:
  tools::xar::detail::LogFatal::~LogFatal((LogFatal *)auStack_238);
}

Assistant:

void check_file_sanity(
    const std::string& path,
    enum Expectation expected,
    mode_t perms) {
  struct stat st;
  XAR_PCHECK_SIMPLE(stat(path.c_str(), &st) == 0);
  if (st.st_uid != geteuid()) {
    XAR_FATAL << "Invalid owner of " << path;
  }

  // Verify the directory is owned by one of the groups the user is in.
  if (st.st_gid != getegid() && !tools::xar::is_user_in_group(st.st_gid)) {
    XAR_FATAL << "Invalid group of " << path;
  }

  if (expected == Expectation::Directory && !S_ISDIR(st.st_mode)) {
    XAR_FATAL << "Should be a directory: " << path;
  }
  if (expected == Expectation::File && !S_ISREG(st.st_mode)) {
    XAR_FATAL << "Should be a normal file: " << path;
  }
  if ((st.st_mode & 07777) != perms) {
    XAR_FATAL << "Invalid permissions on " << path << ", expected " << std::oct
              << perms << ", got " << (st.st_mode & 07777);
  }
}